

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O2

bool __thiscall
GlobOpt::ValidateMemOpCandidates
          (GlobOpt *this,Loop *loop,MemOpEmitData **inOrderEmitData,int *iEmitData)

{
  SListBase<BasicBlock_*,_Memory::ArenaAllocator,_RealCount> *this_00;
  MemOpType MVar1;
  BasicBlock *pBVar2;
  Instr *instr;
  code *pcVar3;
  bool bVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  undefined4 *puVar8;
  Type *ppBVar9;
  Instr *pIVar10;
  Type *ppMVar11;
  MemCopyCandidate *pMVar12;
  MemCopyEmitData *emitData;
  JITTimeFunctionBody *pJVar13;
  char16 *pcVar14;
  char16 *pcVar15;
  Func **ppFVar16;
  ulong uVar17;
  char16_t *form;
  long lVar18;
  Instr **ppIVar19;
  Type pMVar20;
  bool local_e8 [8];
  bool errorInInstr;
  MemOpEmitData **local_88;
  Instr *local_80;
  Type local_78;
  BasicBlock *local_70;
  Phases *local_68;
  undefined4 *local_60;
  undefined1 local_58 [8];
  Iterator iter;
  InductionVariableChangeInfo local_31 [8];
  InductionVariableChangeInfo inductionVariableChangeInfo;
  
  local_88 = inOrderEmitData;
  iter.current = (NodeBase *)loop;
  if (*iEmitData !=
      (loop->memOpInfo->candidates->
      super_SList<Loop::MemOpCandidate_*,_Memory::ArenaAllocator,_RealCount>).
      super_SListBase<Loop::MemOpCandidate_*,_Memory::ArenaAllocator,_RealCount>.super_RealCount.
      count) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar8 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x44ab,"(iEmitData == (int)loop->memOpInfo->candidates->Count())",
                       "iEmitData == (int)loop->memOpInfo->candidates->Count()");
    if (!bVar4) goto LAB_004457be;
    *puVar8 = 0;
  }
  this_00 = (SListBase<BasicBlock_*,_Memory::ArenaAllocator,_RealCount> *)(iter.current + 4);
  if (((SListBase<BasicBlock_*,_Memory::ArenaAllocator,_RealCount> *)iter.current[4].next == this_00
      ) || ((SListBase<BasicBlock_*,_Memory::ArenaAllocator,_RealCount> *)
            ((((SListBase<BasicBlock_*,_Memory::ArenaAllocator,_RealCount> *)iter.current[4].next)->
             super_SListNodeBase<Memory::ArenaAllocator>).next)->next != this_00)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar8 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x44ad,"(loop->blockList.HasTwo())","loop->blockList.HasTwo()");
    if (!bVar4) {
LAB_004457be:
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar8 = 0;
  }
  local_58 = (undefined1  [8])(iter.current[0x30].next)->next;
  iter.list = (SListBase<Loop::MemOpCandidate_*,_Memory::ArenaAllocator,_RealCount> *)local_58;
  ppBVar9 = SListBase<BasicBlock_*,_Memory::ArenaAllocator,_RealCount>::Head(this_00);
  local_70 = (*ppBVar9)->next;
  if (local_70->firstInstr == (Instr *)0x0) {
    local_80 = (Instr *)0x0;
  }
  else {
    local_80 = local_70->firstInstr->m_prev;
  }
  pBVar2 = local_70->next;
  ppFVar16 = (Func **)&pBVar2->firstInstr;
  if (pBVar2 == (BasicBlock *)0x0) {
    ppFVar16 = &local_70->func;
  }
  lVar18 = 0x18;
  if (pBVar2 == (BasicBlock *)0x0) {
    lVar18 = 0xd0;
  }
  ppIVar19 = (Instr **)((long)&(*ppFVar16)->m_alloc + lVar18);
  local_60 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
  local_68 = (Phases *)&DAT_01441eb0;
  emitData = (MemCopyEmitData *)0x0;
  pMVar20 = (Type)0x0;
  pIVar10 = (Instr *)0x0;
  do {
    puVar8 = local_60;
    instr = *ppIVar19;
    if (instr == local_80) {
LAB_004453d8:
      bVar4 = true;
      if ((iter.list != (SListBase<Loop::MemOpCandidate_*,_Memory::ArenaAllocator,_RealCount> *)0x0)
         && ((undefined1  [8])iter.list != local_58)) {
        uVar5 = Func::GetSourceContextId(this->func);
        uVar6 = Func::GetLocalFunctionId(this->func);
        bVar4 = Js::Phases::IsEnabled((Phases *)&DAT_01453738,MemOpPhase,uVar5,uVar6);
        if (!bVar4) {
          uVar5 = Func::GetSourceContextId(this->func);
          uVar6 = Func::GetLocalFunctionId(this->func);
          bVar4 = Js::Phases::IsEnabled((Phases *)&DAT_01453738,MemSetPhase,uVar5,uVar6);
          if (!bVar4) {
            uVar5 = Func::GetSourceContextId(this->func);
            uVar6 = Func::GetLocalFunctionId(this->func);
            bVar4 = Js::Phases::IsEnabled((Phases *)&DAT_01453738,MemCopyPhase,uVar5,uVar6);
            if (!bVar4) {
              return false;
            }
          }
        }
        bVar4 = false;
        Output::Print(L"TRACE MemOp:");
        pJVar13 = Func::GetJITFunctionBody(this->func);
        pcVar14 = JITTimeFunctionBody::GetDisplayName(pJVar13);
        pcVar15 = Func::GetDebugNumberSet(this->func,(wchar (*) [42])local_e8);
        uVar5 = Loop::GetLoopNumber((Loop *)iter.current);
        Output::Print(0xf,L"Function: %s%s, Loop: %u: ",pcVar14,pcVar15,(ulong)uVar5);
        Output::Print(L"Candidates not found in loop while validating");
        Output::Print(L"\n");
        Output::Flush();
      }
      return bVar4;
    }
    if ((pIVar10 != (Instr *)0x0) && (pIVar10->m_prev != instr)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar8 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                         ,0x44b5,
                         "(__nextInstrCheck == nullptr || __nextInstrCheck->m_prev == instr)",
                         "Modifying instr list but not using EDITING iterator!");
      if (!bVar4) goto LAB_004457be;
      *puVar8 = 0;
    }
    if (pMVar20 == (Type)0x0) {
      if (iter.list == (SListBase<Loop::MemOpCandidate_*,_Memory::ArenaAllocator,_RealCount> *)0x0)
      {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar8 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                           ,0x76,"(current != nullptr)","current != nullptr");
        if (!bVar4) goto LAB_004457be;
        *puVar8 = 0;
      }
      iter.list = (SListBase<Loop::MemOpCandidate_*,_Memory::ArenaAllocator,_RealCount> *)
                  ((iter.list)->super_SListNodeBase<Memory::ArenaAllocator>).next;
      if ((undefined1  [8])iter.list == local_58) {
        iter.list = (SListBase<Loop::MemOpCandidate_*,_Memory::ArenaAllocator,_RealCount> *)0x0;
        goto LAB_004453d8;
      }
      ppMVar11 = SListBase<Loop::MemOpCandidate_*,_Memory::ArenaAllocator,_RealCount>::Iterator::
                 Data((Iterator *)local_58);
      pMVar20 = *ppMVar11;
      if (pMVar20 != (Type)0x0) {
        local_31[0] = (InductionVariableChangeInfo)0x0;
        bVar4 = JsUtil::
                BaseDictionary<unsigned_int,_Loop::InductionVariableChangeInfo,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                ::TryGetValue<unsigned_int>
                          ((BaseDictionary<unsigned_int,_Loop::InductionVariableChangeInfo,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                            *)iter.current[0x30].next[2].next,&pMVar20->index,local_31);
        if (!bVar4) {
          if (DAT_0145948a != '\x01') {
            return false;
          }
          uVar5 = Func::GetSourceContextId(this->func);
          uVar6 = Func::GetLocalFunctionId(this->func);
          bVar4 = Js::Phases::IsEnabled((Phases *)&DAT_01453738,MemOpPhase,uVar5,uVar6);
          if (!bVar4) {
            uVar5 = Func::GetSourceContextId(this->func);
            uVar6 = Func::GetLocalFunctionId(this->func);
            bVar4 = Js::Phases::IsEnabled((Phases *)&DAT_01453738,MemSetPhase,uVar5,uVar6);
            if (!bVar4) {
              uVar5 = Func::GetSourceContextId(this->func);
              uVar6 = Func::GetLocalFunctionId(this->func);
              bVar4 = Js::Phases::IsEnabled((Phases *)&DAT_01453738,MemCopyPhase,uVar5,uVar6);
              if (!bVar4) {
                return false;
              }
            }
          }
          Output::Print(L"TRACE MemOp:");
          pJVar13 = Func::GetJITFunctionBody(this->func);
          pcVar14 = JITTimeFunctionBody::GetDisplayName(pJVar13);
          pcVar15 = Func::GetDebugNumberSet(this->func,(wchar (*) [42])local_e8);
          uVar5 = Loop::GetLoopNumber((Loop *)iter.current);
          Output::Print(0xf,L"Function: %s%s, Loop: %u: ",pcVar14,pcVar15,(ulong)uVar5);
          uVar17 = (ulong)pMVar20->base;
          form = L"MemOp skipped (s%d): no induction variable";
LAB_0044578e:
          Output::Print(form,uVar17);
          Output::Print(L"\n");
          Output::Flush();
          return false;
        }
        if (((byte)local_31[0] & 0x7f) != pMVar20->count) {
          if (DAT_0145948a != '\x01') {
            return false;
          }
          uVar5 = Func::GetSourceContextId(this->func);
          uVar6 = Func::GetLocalFunctionId(this->func);
          bVar4 = Js::Phases::IsEnabled((Phases *)&DAT_01453738,MemOpPhase,uVar5,uVar6);
          if (!bVar4) {
            uVar5 = Func::GetSourceContextId(this->func);
            uVar6 = Func::GetLocalFunctionId(this->func);
            bVar4 = Js::Phases::IsEnabled((Phases *)&DAT_01453738,MemSetPhase,uVar5,uVar6);
            if (!bVar4) {
              uVar5 = Func::GetSourceContextId(this->func);
              uVar6 = Func::GetLocalFunctionId(this->func);
              bVar4 = Js::Phases::IsEnabled((Phases *)&DAT_01453738,MemCopyPhase,uVar5,uVar6);
              if (!bVar4) {
                return false;
              }
            }
          }
          Output::Print(L"TRACE MemOp:");
          pJVar13 = Func::GetJITFunctionBody(this->func);
          pcVar14 = JITTimeFunctionBody::GetDisplayName(pJVar13);
          pcVar15 = Func::GetDebugNumberSet(this->func,(wchar (*) [42])local_e8);
          uVar5 = Loop::GetLoopNumber((Loop *)iter.current);
          Output::Print(0xf,L"Function: %s%s, Loop: %u: ",pcVar14,pcVar15,(ulong)uVar5);
          uVar17 = (ulong)pMVar20->base;
          form = L"MemOp skipped (s%d): not matching unroll count";
          goto LAB_0044578e;
        }
        MVar1 = pMVar20->type;
        local_78 = pMVar20;
        uVar5 = Func::GetSourceContextId(this->func);
        uVar6 = Func::GetLocalFunctionId(this->func);
        if (MVar1 == MEMSET) {
          bVar4 = Js::Phases::IsEnabled(local_68,MemSetPhase,uVar5,uVar6);
          puVar8 = local_60;
          pMVar20 = local_78;
          if (bVar4) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar8 = 1;
            bVar4 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                               ,0x44d7,
                               "(!Js::Configuration::Global.flags.Off.IsEnabled(((Js::MemSetPhase)), ((this->func)->GetSourceContextId()), ((this->func)->GetLocalFunctionId())))"
                               ,"!PHASE_OFF(Js::MemSetPhase, this->func)");
            if (!bVar4) goto LAB_004457be;
            *puVar8 = 0;
          }
          emitData = (MemCopyEmitData *)new<Memory::JitArenaAllocator>(0x20,this->alloc,0x3d6ef4);
          (emitData->super_MemOpEmitData).candidate = (MemOpCandidate *)0x0;
          (emitData->super_MemOpEmitData).stElemInstr = (Instr *)0x0;
          (emitData->super_MemOpEmitData).block = (BasicBlock *)0x0;
          (emitData->super_MemOpEmitData).inductionVar = (InductionVariableChangeInfo)0x0;
          *(undefined3 *)&(emitData->super_MemOpEmitData).field_0x19 = 0;
          (emitData->super_MemOpEmitData).bailOutKind = BailOutInvalid;
        }
        else {
          bVar4 = Js::Phases::IsEnabled(local_68,MemCopyPhase,uVar5,uVar6);
          puVar8 = local_60;
          pMVar20 = local_78;
          if (bVar4) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar8 = 1;
            bVar4 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                               ,0x44dc,
                               "(!Js::Configuration::Global.flags.Off.IsEnabled(((Js::MemCopyPhase)), ((this->func)->GetSourceContextId()), ((this->func)->GetLocalFunctionId())))"
                               ,"!PHASE_OFF(Js::MemCopyPhase, this->func)");
            if (!bVar4) goto LAB_004457be;
            *puVar8 = 0;
          }
          if (pMVar20->type != MEMCOPY) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar8 = 1;
            bVar4 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                               ,0x44de,"(candidate->IsMemCopy())","candidate->IsMemCopy()");
            if (!bVar4) goto LAB_004457be;
            *puVar8 = 0;
          }
          pMVar12 = Loop::MemOpCandidate::AsMemCopy(pMVar20);
          if ((((pMVar12->super_MemOpCandidate).base == 0xffffffff) ||
              (pMVar12->ldBase == 0xffffffff)) ||
             (pMVar12->ldCount != (pMVar12->super_MemOpCandidate).count)) {
            uVar5 = Func::GetSourceContextId(this->func);
            uVar6 = Func::GetLocalFunctionId(this->func);
            bVar4 = Js::Phases::IsEnabled((Phases *)&DAT_01453738,MemOpPhase,uVar5,uVar6);
            if (!bVar4) {
              uVar5 = Func::GetSourceContextId(this->func);
              uVar6 = Func::GetLocalFunctionId(this->func);
              bVar4 = Js::Phases::IsEnabled((Phases *)&DAT_01453738,MemCopyPhase,uVar5,uVar6);
              if (!bVar4) {
                return false;
              }
            }
            Output::Print(L"TRACE MemCopy:");
            pJVar13 = Func::GetJITFunctionBody(this->func);
            pcVar14 = JITTimeFunctionBody::GetDisplayName(pJVar13);
            pcVar15 = Func::GetDebugNumberSet(this->func,(wchar (*) [42])local_e8);
            uVar5 = Loop::GetLoopNumber((Loop *)iter.current);
            Output::Print(0xf,L"Function: %s%s, Loop: %u: ",pcVar14,pcVar15,(ulong)uVar5);
            uVar17 = (ulong)pMVar20->base;
            form = L"(s%d): not matching ldElem and stElem";
            goto LAB_0044578e;
          }
          emitData = (MemCopyEmitData *)new<Memory::JitArenaAllocator>(0x28,this->alloc,0x3d6ef4);
          (emitData->super_MemOpEmitData).candidate = (MemOpCandidate *)0x0;
          (emitData->super_MemOpEmitData).stElemInstr = (Instr *)0x0;
          (emitData->super_MemOpEmitData).block = (BasicBlock *)0x0;
          (emitData->super_MemOpEmitData).inductionVar = (InductionVariableChangeInfo)0x0;
          *(undefined3 *)&(emitData->super_MemOpEmitData).field_0x19 = 0;
          (emitData->super_MemOpEmitData).bailOutKind = BailOutInvalid;
          emitData->ldElemInstr = (Instr *)0x0;
        }
        (emitData->super_MemOpEmitData).block = local_70;
        (emitData->super_MemOpEmitData).inductionVar = local_31[0];
        (emitData->super_MemOpEmitData).candidate = pMVar20;
        goto LAB_00445209;
      }
LAB_004452c3:
      pMVar20 = (Type)0x0;
    }
    else {
LAB_00445209:
      local_e8[0] = false;
      if (pMVar20->type == MEMSET) {
        bVar4 = InspectInstrForMemSetCandidate
                          (this,(Loop *)iter.current,instr,(MemSetEmitData *)emitData,local_e8);
      }
      else {
        bVar4 = InspectInstrForMemCopyCandidate(this,(Loop *)iter.current,instr,emitData,local_e8);
      }
      if (local_e8[0] != false) {
        Memory::
        DeleteObject<Memory::JitArenaAllocator,(Memory::AllocatorDeleteFlags)0,MemOpEmitData>
                  (this->alloc,&emitData->super_MemOpEmitData);
        return false;
      }
      if (bVar4 != false) {
        iVar7 = *iEmitData;
        if (iVar7 < 1) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar8 = 1;
          bVar4 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                             ,0x44fa,"(iEmitData > 0)","iEmitData > 0");
          if (!bVar4) goto LAB_004457be;
          *puVar8 = 0;
          iVar7 = *iEmitData;
          if (iVar7 == 0) goto LAB_004453d8;
        }
        *iEmitData = iVar7 + -1;
        local_88[iVar7 + -1] = &emitData->super_MemOpEmitData;
        emitData = (MemCopyEmitData *)0x0;
        goto LAB_004452c3;
      }
    }
    ppIVar19 = &instr->m_prev;
    pIVar10 = instr;
  } while( true );
}

Assistant:

bool
GlobOpt::ValidateMemOpCandidates(Loop * loop, _Out_writes_(iEmitData) MemOpEmitData** inOrderEmitData, int& iEmitData)
{
    AnalysisAssert(iEmitData == (int)loop->memOpInfo->candidates->Count());
    // We iterate over the second block of the loop only. MemOp Works only if the loop has exactly 2 blocks
    Assert(loop->blockList.HasTwo());

    Loop::MemOpList::Iterator iter(loop->memOpInfo->candidates);
    BasicBlock* bblock = loop->blockList.Head()->next;
    Loop::MemOpCandidate* candidate = nullptr;
    MemOpEmitData* emitData = nullptr;

    // Iterate backward because the list of candidate is reversed
    FOREACH_INSTR_BACKWARD_IN_BLOCK(instr, bblock)
    {
        if (!candidate)
        {
            // Time to check next candidate
            if (!iter.Next())
            {
                // We have been through the whole list of candidates, finish
                break;
            }
            candidate = iter.Data();
            if (!candidate)
            {
                continue;
            }

            // Common check for memset and memcopy
            Loop::InductionVariableChangeInfo inductionVariableChangeInfo = { 0, 0 };

            // Get the inductionVariable changeInfo
            if (!loop->memOpInfo->inductionVariableChangeInfoMap->TryGetValue(candidate->index, &inductionVariableChangeInfo))
            {
                TRACE_MEMOP_VERBOSE(loop, nullptr, _u("MemOp skipped (s%d): no induction variable"), candidate->base);
                return false;
            }

            if (inductionVariableChangeInfo.unroll != candidate->count)
            {
                TRACE_MEMOP_VERBOSE(loop, nullptr, _u("MemOp skipped (s%d): not matching unroll count"), candidate->base);
                return false;
            }

            if (candidate->IsMemSet())
            {
                Assert(!PHASE_OFF(Js::MemSetPhase, this->func));
                emitData = JitAnew(this->alloc, MemSetEmitData);
            }
            else
            {
                Assert(!PHASE_OFF(Js::MemCopyPhase, this->func));
                // Specific check for memcopy
                Assert(candidate->IsMemCopy());
                Loop::MemCopyCandidate* memcopyCandidate = candidate->AsMemCopy();

                if (memcopyCandidate->base == Js::Constants::InvalidSymID
                    || memcopyCandidate->ldBase == Js::Constants::InvalidSymID
                    || (memcopyCandidate->ldCount != memcopyCandidate->count))
                {
                    TRACE_MEMOP_PHASE(MemCopy, loop, nullptr, _u("(s%d): not matching ldElem and stElem"), candidate->base);
                    return false;
                }
                emitData = JitAnew(this->alloc, MemCopyEmitData);
            }
            Assert(emitData);
            emitData->block = bblock;
            emitData->inductionVar = inductionVariableChangeInfo;
            emitData->candidate = candidate;
        }
        bool errorInInstr = false;
        bool candidateFound = candidate->IsMemSet() ?
            InspectInstrForMemSetCandidate(loop, instr, (MemSetEmitData*)emitData, errorInInstr)
            : InspectInstrForMemCopyCandidate(loop, instr, (MemCopyEmitData*)emitData, errorInInstr);
        if (errorInInstr)
        {
            JitAdelete(this->alloc, emitData);
            return false;
        }
        if (candidateFound)
        {
            AnalysisAssert(iEmitData > 0);
            if (iEmitData == 0)
            {
                // Explicit for OACR
                break;
            }
            inOrderEmitData[--iEmitData] = emitData;
            candidate = nullptr;
            emitData = nullptr;

        }
    } NEXT_INSTR_BACKWARD_IN_BLOCK;

    if (iter.IsValid())
    {
        TRACE_MEMOP(loop, nullptr, _u("Candidates not found in loop while validating"));
        return false;
    }
    return true;
}